

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar7;
  long lVar8;
  LinkClosure *pLVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  byte local_572;
  bool local_515;
  byte local_514;
  byte local_513;
  bool local_4fb;
  byte local_4fa;
  char *dirs;
  undefined1 local_4b8 [8];
  string dirVar;
  undefined1 local_478 [8];
  string useVar;
  string *li;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  LinkClosure *lc;
  string local_410 [8];
  string suffix_1;
  undefined1 local_3d0 [8];
  string d_1;
  string *topSourceDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  string local_328 [8];
  string suffix;
  undefined1 local_2e8 [8];
  string d;
  string *ri;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *topBinaryDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rdirs;
  string local_290;
  string *local_270;
  string *installPrefix;
  string local_260;
  char *local_240;
  char *stagePath;
  string local_230;
  allocator<char> local_209;
  string local_208;
  char *local_1e8;
  char *sysrootLink;
  string rootPath;
  string build_rpath;
  string install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool use_relative_build_rpath;
  string targetOutputDir;
  string local_f8;
  string *local_d8;
  string *originToken;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [2];
  bool use_link_rpath;
  bool use_build_rpath;
  bool use_install_rpath;
  byte local_55;
  bool linking_for_install;
  allocator<char> local_41;
  string local_40;
  byte local_1a;
  byte local_19;
  bool outputRuntime;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool for_install_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *runtimeDirs_local;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_19 = for_install;
  pvStack_18 = runtimeDirs;
  runtimeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  local_4fa = 0;
  if (!bVar3) {
    local_4fa = std::__cxx11::string::empty();
    local_4fa = local_4fa ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1a = local_4fa & 1;
  local_7a = 0;
  local_7b = 0;
  local_4fb = true;
  if ((local_19 & 1) == 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
    local_7b = 1;
    local_4fb = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_78);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  local_55 = local_4fb;
  local_513 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target,&this->Config);
    local_513 = 0;
    if (bVar3) {
      local_513 = local_55;
    }
  }
  local_7c = local_513 & 1;
  local_514 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_514 = 0;
    if (bVar3) {
      local_514 = local_55 ^ 0xff;
    }
  }
  local_7d = local_514 & 1;
  local_a2 = 0;
  local_a3 = 0;
  originToken._6_1_ = 0;
  originToken._5_1_ = 0;
  local_515 = false;
  if (((local_1a & 1) != 0) && (local_515 = false, (local_55 & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH",&local_a1);
    local_a3 = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_515 = false;
    if (!bVar3) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      originToken._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"INSTALL_RPATH_USE_LINK_PATH",
                 (allocator<char> *)((long)&originToken + 7));
      originToken._5_1_ = 1;
      local_515 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_c8);
    }
  }
  if ((originToken._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((originToken._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&originToken + 7));
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  local_7e = local_515;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  local_d8 = psVar5;
  cmGeneratorTarget::GetDirectory
            ((string *)local_120,this->Target,&this->Config,RuntimeBinaryArtifact);
  pcVar2 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"BUILD_RPATH_USE_ORIGIN",
             (allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_148);
  local_572 = 0;
  if (bVar3) {
    uVar4 = std::__cxx11::string::empty();
    local_572 = 0;
    if ((uVar4 & 1) == 0) {
      local_572 = std::__cxx11::string::empty();
      local_572 = local_572 ^ 0xff;
    }
  }
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_121 = local_572 & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&install_rpath.field_2 + 8));
  if ((local_7c & 1) != 0) {
    std::__cxx11::string::string((string *)(build_rpath.field_2._M_local_buf + 8));
    cmGeneratorTarget::GetInstallRPATH
              (this->Target,&this->Config,(string *)(build_rpath.field_2._M_local_buf + 8));
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCLI_ExpandListUnique
              (pcVar6,pvStack_18,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&install_rpath.field_2 + 8));
    std::__cxx11::string::~string((string *)(build_rpath.field_2._M_local_buf + 8));
  }
  if ((local_7d & 1) != 0) {
    std::__cxx11::string::string((string *)(rootPath.field_2._M_local_buf + 8));
    bVar3 = cmGeneratorTarget::GetBuildRPATH
                      (this->Target,&this->Config,(string *)(rootPath.field_2._M_local_buf + 8));
    if (bVar3) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCLI_ExpandListUnique
                (pcVar6,pvStack_18,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&install_rpath.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)(rootPath.field_2._M_local_buf + 8));
  }
  if (((local_7d & 1) != 0) || ((local_7e & 1) != 0)) {
    std::__cxx11::string::string((string *)&sysrootLink);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"CMAKE_SYSROOT_LINK",&local_209);
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    local_1e8 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CMAKE_SYSROOT",(allocator<char> *)((long)&stagePath + 7));
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_230);
      std::__cxx11::string::operator=((string *)&sysrootLink,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath + 7));
    }
    else {
      std::__cxx11::string::operator=((string *)&sysrootLink,pcVar6);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"CMAKE_STAGING_PREFIX",
               (allocator<char> *)((long)&installPrefix + 7));
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    pcVar1 = this->Makefile;
    local_240 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"CMAKE_INSTALL_PREFIX",(allocator<char> *)((long)&rdirs + 7));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdirs + 7));
    local_270 = psVar5;
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&sysrootLink);
    this_00 = GetRuntimeSearchPath_abi_cxx11_(this);
    psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    ri = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ri), bVar3) {
      d.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      if ((local_7d & 1) == 0) {
        if ((local_7e & 1) != 0) {
          d_1.field_2._8_8_ = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
          bVar3 = cmsys::SystemTools::ComparePath
                            ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_);
          if ((((!bVar3) &&
               (bVar3 = cmsys::SystemTools::ComparePath((string *)d.field_2._8_8_,psVar5), !bVar3))
              && (bVar3 = cmsys::SystemTools::IsSubDirectory
                                    ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_), !bVar3)
              ) && (bVar3 = cmsys::SystemTools::IsSubDirectory((string *)d.field_2._8_8_,psVar5),
                   !bVar3)) {
            std::__cxx11::string::string((string *)local_3d0,(string *)d.field_2._8_8_);
            uVar7 = std::__cxx11::string::empty();
            if (((uVar7 & 1) == 0) &&
               (lVar8 = std::__cxx11::string::find((string *)local_3d0,(ulong)&sysrootLink),
               lVar8 == 0)) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)((long)&suffix_1.field_2 + 8),(ulong)local_3d0);
              std::__cxx11::string::operator=
                        ((string *)local_3d0,(string *)(suffix_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(suffix_1.field_2._M_local_buf + 8));
            }
            else if ((local_240 != (char *)0x0) &&
                    ((*local_240 != '\0' &&
                     (lVar8 = std::__cxx11::string::find(local_3d0,(ulong)local_240), lVar8 == 0))))
            {
              strlen(local_240);
              std::__cxx11::string::substr((ulong)local_410,(ulong)local_3d0);
              std::__cxx11::string::operator=((string *)local_3d0,(string *)local_270);
              std::__cxx11::string::operator+=((string *)local_3d0,"/");
              std::__cxx11::string::operator+=((string *)local_3d0,local_410);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_3d0);
              std::__cxx11::string::~string(local_410);
            }
            pVar10 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&install_rpath.field_2 + 8),(value_type *)local_3d0);
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvStack_18,(value_type *)local_3d0);
            }
            std::__cxx11::string::~string((string *)local_3d0);
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)local_2e8,(string *)d.field_2._8_8_);
        uVar7 = std::__cxx11::string::empty();
        if (((uVar7 & 1) == 0) &&
           (lVar8 = std::__cxx11::string::find((string *)local_2e8,(ulong)&sysrootLink), lVar8 == 0)
           ) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&suffix.field_2 + 8),(ulong)local_2e8);
          std::__cxx11::string::operator=
                    ((string *)local_2e8,(string *)(suffix.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
        }
        else if ((local_240 == (char *)0x0) ||
                ((*local_240 == '\0' ||
                 (lVar8 = std::__cxx11::string::find(local_2e8,(ulong)local_240), lVar8 != 0)))) {
          if (((local_121 & 1) != 0) &&
             ((bVar3 = cmsys::SystemTools::ComparePath((string *)local_2e8,psVar5), bVar3 ||
              (bVar3 = cmsys::SystemTools::IsSubDirectory((string *)local_2e8,psVar5), bVar3)))) {
            cmSystemTools::RelativePath(&local_348,(string *)local_120,(string *)local_2e8);
            std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              std::operator+(&local_388,local_d8,"/");
              std::operator+(&local_368,&local_388,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e8);
              std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_368);
              std::__cxx11::string::~string((string *)&local_368);
              std::__cxx11::string::~string((string *)&local_388);
            }
            else {
              std::__cxx11::string::operator=((string *)local_2e8,(string *)local_d8);
            }
          }
        }
        else {
          strlen(local_240);
          std::__cxx11::string::substr((ulong)local_328,(ulong)local_2e8);
          std::__cxx11::string::operator=((string *)local_2e8,(string *)local_270);
          std::__cxx11::string::operator+=((string *)local_2e8,"/");
          std::__cxx11::string::operator+=((string *)local_2e8,local_328);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_2e8);
          std::__cxx11::string::~string(local_328);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&install_rpath.field_2 + 8),(value_type *)local_2e8);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_18,(value_type *)local_2e8);
        }
        std::__cxx11::string::~string((string *)local_2e8);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&sysrootLink);
  }
  pLVar9 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pLVar9->Languages);
  li = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pLVar9->Languages);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&li), bVar3) {
    useVar.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   useVar.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)(dirVar.field_2._M_local_buf + 8));
    bVar3 = cmMakefile::IsOn(this->Makefile,(string *)local_478);
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              useVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&dirs);
      pcVar6 = cmMakefile::GetDefinition(this->Makefile,(string *)local_4b8);
      if (pcVar6 != (char *)0x0) {
        cmCLI_ExpandListUnique
                  (pcVar6,pvStack_18,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&install_rpath.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_4b8);
    }
    std::__cxx11::string::~string((string *)local_478);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCLI_ExpandListUnique
            (pcVar6,pvStack_18,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&install_rpath.field_2 + 8));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&install_rpath.field_2 + 8));
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath.c_str(), runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath.c_str(), runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}